

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManCleanWatch(Cbs2_Man_t *p)

{
  int iVar1;
  int local_14;
  int iLit;
  int i;
  Cbs2_Man_t *p_local;
  
  for (local_14 = 0; iVar1 = Vec_IntSize(&p->vWatchUpds), local_14 < iVar1; local_14 = local_14 + 1)
  {
    iVar1 = Vec_IntEntry(&p->vWatchUpds,local_14);
    Vec_IntWriteEntry(&p->vWatches,iVar1,0);
  }
  Vec_IntClear(&p->vWatchUpds);
  return;
}

Assistant:

static inline void Cbs2_ManCleanWatch( Cbs2_Man_t * p )
{
    int i, iLit;
    Vec_IntForEachEntry( &p->vWatchUpds, iLit, i )
        Vec_IntWriteEntry( &p->vWatches, iLit, 0 );
    Vec_IntClear( &p->vWatchUpds );
    //Vec_IntForEachEntry( &p->vWatches, iLit, i )
    //    assert( iLit == 0 );
}